

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::ServiceDescriptor::CopyTo(ServiceDescriptor *this,ServiceDescriptorProto *proto)

{
  string *initial_value;
  string *psVar1;
  long lVar2;
  Type *proto_00;
  ServiceOptions *pSVar3;
  ServiceOptions *pSVar4;
  long lVar5;
  long lVar6;
  
  initial_value = *(string **)this;
  (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 1;
  psVar1 = (proto->name_).ptr_;
  if (psVar1 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstanceNoArena(&proto->name_,initial_value);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar1);
  }
  if (0 < *(int *)(this + 0x20)) {
    lVar6 = 0;
    lVar5 = 0;
    do {
      lVar2 = *(long *)(this + 0x28);
      proto_00 = internal::RepeatedPtrFieldBase::
                 Add<google::protobuf::RepeatedPtrField<google::protobuf::MethodDescriptorProto>::TypeHandler>
                           (&(proto->method_).super_RepeatedPtrFieldBase,(Type *)0x0);
      MethodDescriptor::CopyTo((MethodDescriptor *)(lVar2 + lVar6),proto_00);
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x68;
    } while (lVar5 < *(int *)(this + 0x20));
  }
  pSVar4 = *(ServiceOptions **)(this + 0x18);
  pSVar3 = ServiceOptions::default_instance();
  if (pSVar4 != pSVar3) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 2;
    pSVar4 = proto->options_;
    if (pSVar4 == (ServiceOptions *)0x0) {
      pSVar4 = (ServiceOptions *)operator_new(0x70);
      ServiceOptions::ServiceOptions(pSVar4);
      proto->options_ = pSVar4;
    }
    ServiceOptions::CopyFrom(pSVar4,*(ServiceOptions **)(this + 0x18));
    return;
  }
  return;
}

Assistant:

void ServiceDescriptor::CopyTo(ServiceDescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < method_count(); i++) {
    method(i)->CopyTo(proto->add_method());
  }

  if (&options() != &ServiceOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}